

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O3

void __thiscall
libcellml::Validator::ValidatorImpl::buildComponentIdMap
          (ValidatorImpl *this,ComponentPtr *component,IdMap *idMap,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *reportedConnections)

{
  _func_int **pp_Var1;
  element_type *peVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  IssueImpl *pIVar4;
  undefined8 uVar5;
  size_type sVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  long *plVar10;
  undefined8 *puVar11;
  size_t sVar12;
  const_iterator cVar13;
  size_type *psVar14;
  element_type *peVar15;
  ValidatorImpl *pVVar16;
  Entity *pEVar17;
  undefined8 *puVar18;
  Entity *pEVar19;
  NamedEntity *pNVar20;
  IdMap *pIVar21;
  element_type *peVar22;
  ulong *puVar23;
  long *plVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  ulong uVar26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var27;
  long lVar28;
  char cVar29;
  _func_int **pp_Var30;
  ValidatorImpl *pVVar31;
  undefined8 uVar32;
  element_type *peVar33;
  element_type *peVar34;
  ulong uVar35;
  NamedEntity *pNVar36;
  pointer pcVar37;
  string owning;
  string mappingId;
  string imported;
  string connectionId;
  string connection;
  string connectionDescription;
  ResetPtr item_1;
  IssuePtr issue;
  string info;
  IssuePtr issue_1;
  VariablePtr item;
  VariablePtr equiv;
  ComponentPtr equivParent;
  undefined1 local_2d0 [32];
  undefined1 local_2b0 [32];
  undefined1 local_290 [32];
  string local_270;
  undefined1 local_250 [32];
  Validator *local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [32];
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  IdMap *local_1a8;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  IssuePtr local_160;
  element_type local_150;
  ValidatorImpl *local_140;
  undefined1 local_138 [24];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  string local_108;
  undefined1 local_e8 [24];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_b8;
  ParentedEntityConstPtr local_b0;
  string local_a0;
  string local_80;
  string local_60;
  ulong local_40;
  _Base_ptr local_38;
  
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  local_1a0._M_string_length = 0;
  local_1a0.field_2._M_local_buf[0] = '\0';
  local_230 = (Validator *)component;
  local_1a8 = idMap;
  local_140 = this;
  local_b8 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)reportedConnections;
  Entity::id_abi_cxx11_
            ((string *)local_290,
             (Entity *)
             (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  uVar32 = local_290._8_8_;
  pNVar36 = (NamedEntity *)(local_290 + 0x10);
  if ((NamedEntity *)local_290._0_8_ != pNVar36) {
    operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_290._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_290._16_8_ = local_290._16_8_ & 0xffffffffffffff00;
    local_2d0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2d0._16_8_ = local_2d0._16_8_ & 0xffffffffffffff00;
    local_2d0._0_8_ = (IdMap *)(local_2d0 + 0x10);
    local_290._0_8_ = pNVar36;
    bVar8 = ImportedEntity::isImport
                      (&((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                        &local_230->super_Logger)->_M_ptr->super_ImportedEntity);
    if (bVar8) {
      std::__cxx11::string::_M_replace((ulong)local_290,0,(char *)local_290._8_8_,0x2a93e3);
    }
    local_270._M_dataplus._M_p =
         (pointer)((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                  &local_230->super_Logger)->_M_ptr;
    local_270._M_string_length =
         (size_type)
         (((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
          &local_230->super_Logger)->_M_refcount)._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._M_string_length)->
             _M_use_count + 1;
      }
    }
    owningComponent((ParentedEntityConstPtr *)local_2b0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._M_string_length);
    }
    if ((Entity *)local_2b0._0_8_ == (Entity *)0x0) {
      local_208._0_8_ =
           ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
           &local_230->super_Logger)->_M_ptr;
      local_208._8_8_ =
           (((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
            &local_230->super_Logger)->_M_refcount)._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_)->_M_use_count + 1;
        }
      }
      owningModel((ParentedEntityConstPtr *)&local_228);
      NamedEntity::name_abi_cxx11_((string *)local_250,(NamedEntity *)local_228._M_dataplus._M_p);
      puVar11 = (undefined8 *)std::__cxx11::string::replace((ulong)local_250,0,(char *)0x0,0x2a9347)
      ;
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      psVar14 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_270.field_2._M_allocated_capacity = *psVar14;
        local_270.field_2._8_8_ = puVar11[3];
      }
      else {
        local_270.field_2._M_allocated_capacity = *psVar14;
        local_270._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_270._M_string_length = puVar11[1];
      *puVar11 = psVar14;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_270);
    }
    else {
      local_208._0_8_ =
           ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
           &local_230->super_Logger)->_M_ptr;
      local_208._8_8_ =
           (((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
            &local_230->super_Logger)->_M_refcount)._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_)->_M_use_count + 1;
        }
      }
      owningComponent((ParentedEntityConstPtr *)&local_228);
      NamedEntity::name_abi_cxx11_((string *)local_250,(NamedEntity *)local_228._M_dataplus._M_p);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)local_250,0,(char *)0x0,0x28f5b5);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      psVar14 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_270.field_2._M_allocated_capacity = *psVar14;
        local_270.field_2._8_8_ = plVar10[3];
      }
      else {
        local_270.field_2._M_allocated_capacity = *psVar14;
        local_270._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_270._M_string_length = plVar10[1];
      *plVar10 = (long)psVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_270);
    }
    peVar15 = (element_type *)(plVar10 + 2);
    if ((element_type *)*plVar10 == peVar15) {
      local_2b0._16_8_ = (peVar15->super_Entity)._vptr_Entity;
      local_2b0._24_8_ = plVar10[3];
      local_2b0._0_8_ = (element_type *)(local_2b0 + 0x10);
    }
    else {
      local_2b0._16_8_ = (peVar15->super_Entity)._vptr_Entity;
      local_2b0._0_8_ = (element_type *)*plVar10;
    }
    local_2b0._8_8_ = plVar10[1];
    *plVar10 = (long)peVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_2d0,(string *)local_2b0);
    if ((element_type *)local_2b0._0_8_ != (element_type *)(local_2b0 + 0x10)) {
      operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if ((ValidatorImpl *)local_250._0_8_ != (ValidatorImpl *)(local_250 + 0x10)) {
      operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._M_string_length);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
    }
    std::operator+(&local_228," - ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_228);
    pVVar31 = (ValidatorImpl *)(local_250 + 0x10);
    pVVar16 = (ValidatorImpl *)(plVar10 + 2);
    if ((ValidatorImpl *)*plVar10 == pVVar16) {
      local_250._16_8_ =
           (pVVar16->super_LoggerImpl).mErrors.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_250._24_8_ = plVar10[3];
      local_250._0_8_ = pVVar31;
    }
    else {
      local_250._16_8_ =
           (pVVar16->super_LoggerImpl).mErrors.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_250._0_8_ = (ValidatorImpl *)*plVar10;
    }
    local_250._8_8_ = plVar10[1];
    *plVar10 = (long)pVVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    NamedEntity::name_abi_cxx11_
              ((string *)local_208,
               (NamedEntity *)
               ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
               &local_230->super_Logger)->_M_ptr);
    pp_Var1 = (_func_int **)
              ((long)&((__shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_
                      )->_M_ptr + (long)(_func_int ***)local_208._8_8_);
    pp_Var30 = (_func_int **)0xf;
    if ((ValidatorImpl *)local_250._0_8_ != pVVar31) {
      pp_Var30 = (_func_int **)local_250._16_8_;
    }
    if (pp_Var30 < pp_Var1) {
      pp_Var30 = (_func_int **)0xf;
      if ((ValidatorImpl *)local_208._0_8_ != (ValidatorImpl *)(local_208 + 0x10)) {
        pp_Var30 = (_func_int **)local_208._16_8_;
      }
      if (pp_Var30 < pp_Var1) goto LAB_0027d470;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,local_250._0_8_);
    }
    else {
LAB_0027d470:
      puVar11 = (undefined8 *)std::__cxx11::string::_M_append(local_250,local_208._0_8_);
    }
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    puVar18 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar18) {
      local_270.field_2._M_allocated_capacity = *puVar18;
      local_270.field_2._8_8_ = puVar11[3];
    }
    else {
      local_270.field_2._M_allocated_capacity = *puVar18;
      local_270._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_270._M_string_length = puVar11[1];
    *puVar11 = puVar18;
    puVar11[1] = 0;
    *(undefined1 *)puVar18 = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_270,local_2d0._0_8_);
    pEVar19 = (Entity *)(local_2b0 + 0x10);
    pEVar17 = (Entity *)(plVar10 + 2);
    if ((Entity *)*plVar10 == pEVar17) {
      local_2b0._16_8_ = pEVar17->_vptr_Entity;
      local_2b0._24_8_ = plVar10[3];
      local_2b0._0_8_ = pEVar19;
    }
    else {
      local_2b0._16_8_ = pEVar17->_vptr_Entity;
      local_2b0._0_8_ = (Entity *)*plVar10;
    }
    local_2b0._8_8_ = plVar10[1];
    *plVar10 = (long)pEVar17;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a0,(string *)local_2b0);
    if ((Entity *)local_2b0._0_8_ != pEVar19) {
      operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,
                      (ulong)(local_270.field_2._M_allocated_capacity + 1));
    }
    if ((ValidatorImpl *)local_208._0_8_ != (ValidatorImpl *)(local_208 + 0x10)) {
      operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
    }
    if ((ValidatorImpl *)local_250._0_8_ != pVVar31) {
      operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,
                      (ulong)(local_228.field_2._M_allocated_capacity + 1));
    }
    pVVar31 = (ValidatorImpl *)local_2b0;
    Entity::id_abi_cxx11_
              ((string *)pVVar31,
               (Entity *)
               ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
               &local_230->super_Logger)->_M_ptr);
    addIdMapItem(pVVar31,(string *)local_2b0,&local_1a0,local_1a8);
    if ((Entity *)local_2b0._0_8_ != pEVar19) {
      operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
    }
    if ((IdMap *)local_2d0._0_8_ != (IdMap *)(local_2d0 + 0x10)) {
      operator_delete((void *)local_2d0._0_8_,(ulong)(local_2d0._16_8_ + 1));
    }
    if ((NamedEntity *)local_290._0_8_ != pNVar36) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
  }
  paVar3 = &local_1c8.field_2;
  local_38 = (_Base_ptr)(local_b8 + 8);
  uVar35 = 0;
  while( true ) {
    pNVar36 = (NamedEntity *)(local_290 + 0x10);
    sVar12 = Component::variableCount
                       (((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                        &local_230->super_Logger)->_M_ptr);
    if (sVar12 <= uVar35) break;
    Component::variable((Component *)local_138,
                        (size_t)((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                                &local_230->super_Logger)->_M_ptr);
    local_40 = uVar35;
    Entity::id_abi_cxx11_((string *)local_290,(Entity *)local_138._0_8_);
    uVar32 = local_290._8_8_;
    if ((NamedEntity *)local_290._0_8_ != pNVar36) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      NamedEntity::name_abi_cxx11_((string *)local_250,(NamedEntity *)local_138._0_8_);
      puVar11 = (undefined8 *)std::__cxx11::string::replace((ulong)local_250,0,(char *)0x0,0x2a93ed)
      ;
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      puVar18 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar18) {
        local_270.field_2._M_allocated_capacity = *puVar18;
        local_270.field_2._8_8_ = puVar11[3];
      }
      else {
        local_270.field_2._M_allocated_capacity = *puVar18;
        local_270._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_270._M_string_length = puVar11[1];
      *puVar11 = puVar18;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_270);
      local_2b0._0_8_ = local_2b0 + 0x10;
      pEVar19 = (Entity *)(plVar10 + 2);
      if ((Entity *)*plVar10 == pEVar19) {
        local_2b0._16_8_ = pEVar19->_vptr_Entity;
        local_2b0._24_8_ = plVar10[3];
      }
      else {
        local_2b0._16_8_ = pEVar19->_vptr_Entity;
        local_2b0._0_8_ = (Entity *)*plVar10;
      }
      local_2b0._8_8_ = plVar10[1];
      *plVar10 = (long)pEVar19;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      NamedEntity::name_abi_cxx11_
                (&local_228,
                 (NamedEntity *)
                 ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_230->super_Logger)->_M_ptr);
      peVar33 = (element_type *)0xf;
      if ((Entity *)local_2b0._0_8_ != (Entity *)(local_2b0 + 0x10)) {
        peVar33 = (element_type *)local_2b0._16_8_;
      }
      peVar34 = (element_type *)
                ((long)(_func_int ***)local_2b0._8_8_ +
                (long)(_func_int ***)local_228._M_string_length);
      if (peVar33 < peVar34) {
        uVar32 = (element_type *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          uVar32 = local_228.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar32 < peVar34) goto LAB_0027d829;
        plVar10 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_228,0,(char *)0x0,local_2b0._0_8_);
      }
      else {
LAB_0027d829:
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)local_2b0,(ulong)local_228._M_dataplus._M_p);
      }
      local_2d0._0_8_ = local_2d0 + 0x10;
      pIVar21 = (IdMap *)(plVar10 + 2);
      if ((IdMap *)*plVar10 == pIVar21) {
        local_2d0._16_8_ = *(undefined8 *)&(pIVar21->_M_t)._M_impl;
        local_2d0._24_8_ = plVar10[3];
      }
      else {
        local_2d0._16_8_ = *(undefined8 *)&(pIVar21->_M_t)._M_impl;
        local_2d0._0_8_ = (IdMap *)*plVar10;
      }
      local_2d0._8_8_ = plVar10[1];
      *plVar10 = (long)pIVar21;
      plVar10[1] = 0;
      *(undefined1 *)&(pIVar21->_M_t)._M_impl = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_2d0);
      pNVar20 = (NamedEntity *)(plVar10 + 2);
      if ((NamedEntity *)*plVar10 == pNVar20) {
        local_290._16_8_ = (pNVar20->super_ParentedEntity).super_Entity._vptr_Entity;
        local_290._24_8_ = plVar10[3];
        local_290._0_8_ = pNVar36;
      }
      else {
        local_290._16_8_ = (pNVar20->super_ParentedEntity).super_Entity._vptr_Entity;
        local_290._0_8_ = (NamedEntity *)*plVar10;
      }
      local_290._8_8_ = plVar10[1];
      *plVar10 = (long)pNVar20;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_1a0,(string *)local_290);
      if ((NamedEntity *)local_290._0_8_ != pNVar36) {
        operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
      }
      if ((IdMap *)local_2d0._0_8_ != (IdMap *)(local_2d0 + 0x10)) {
        operator_delete((void *)local_2d0._0_8_,(ulong)(local_2d0._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,
                        (ulong)(local_228.field_2._M_allocated_capacity + 1));
      }
      if ((Entity *)local_2b0._0_8_ != (Entity *)(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,
                        (ulong)(local_270.field_2._M_allocated_capacity + 1));
      }
      if ((ValidatorImpl *)local_250._0_8_ != (ValidatorImpl *)(local_250 + 0x10)) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
      }
      pVVar31 = (ValidatorImpl *)local_290;
      Entity::id_abi_cxx11_((string *)local_290,(Entity *)local_138._0_8_);
      addIdMapItem(pVVar31,(string *)local_290,&local_1a0,local_1a8);
      if ((NamedEntity *)local_290._0_8_ != pNVar36) {
        operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
      }
    }
    uVar35 = 0;
    while( true ) {
      sVar12 = Variable::equivalentVariableCount((Variable *)local_138._0_8_);
      if (sVar12 <= uVar35) break;
      Variable::equivalentVariable((Variable *)local_e8,local_138._0_8_);
      local_290._0_8_ = local_e8._0_8_;
      local_290._8_8_ = local_e8._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_e8._8_8_ + 8) = *(_Atomic_word *)(local_e8._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_e8._8_8_ + 8) = *(_Atomic_word *)(local_e8._8_8_ + 8) + 1;
        }
      }
      owningComponent(&local_b0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290._8_8_);
      }
      if (local_b0.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        NamedEntity::name_abi_cxx11_((string *)local_2d0,(NamedEntity *)local_138._0_8_);
        NamedEntity::name_abi_cxx11_
                  ((string *)local_2b0,
                   (NamedEntity *)
                   ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_230->super_Logger)->_M_ptr);
        peVar33 = (element_type *)0xf;
        if ((IdMap *)local_2d0._0_8_ != (IdMap *)(local_2d0 + 0x10)) {
          peVar33 = (element_type *)local_2d0._16_8_;
        }
        peVar34 = (element_type *)
                  ((long)(_func_int ***)local_2d0._8_8_ + (long)(_func_int ***)local_2b0._8_8_);
        if (peVar33 < peVar34) {
          peVar33 = (element_type *)0xf;
          if ((Entity *)local_2b0._0_8_ != (Entity *)(local_2b0 + 0x10)) {
            peVar33 = (element_type *)local_2b0._16_8_;
          }
          if (peVar33 < peVar34) goto LAB_0027dadf;
          plVar10 = (long *)std::__cxx11::string::replace
                                      ((ulong)local_2b0,0,(char *)0x0,local_2d0._0_8_);
        }
        else {
LAB_0027dadf:
          plVar10 = (long *)std::__cxx11::string::_M_append(local_2d0,local_2b0._0_8_);
        }
        pNVar36 = (NamedEntity *)(plVar10 + 2);
        if ((NamedEntity *)*plVar10 == pNVar36) {
          local_290._16_8_ = (pNVar36->super_ParentedEntity).super_Entity._vptr_Entity;
          local_290._24_8_ = plVar10[3];
          local_290._0_8_ = (NamedEntity *)(local_290 + 0x10);
        }
        else {
          local_290._16_8_ = (pNVar36->super_ParentedEntity).super_Entity._vptr_Entity;
          local_290._0_8_ = (NamedEntity *)*plVar10;
        }
        local_290._8_8_ = plVar10[1];
        *plVar10 = (long)pNVar36;
        plVar10[1] = 0;
        *(undefined1 *)&(pNVar36->super_ParentedEntity).super_Entity._vptr_Entity = 0;
        if ((Entity *)local_2b0._0_8_ != (Entity *)(local_2b0 + 0x10)) {
          operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
        }
        if ((IdMap *)local_2d0._0_8_ != (IdMap *)(local_2d0 + 0x10)) {
          operator_delete((void *)local_2d0._0_8_,(ulong)(local_2d0._16_8_ + 1));
        }
        NamedEntity::name_abi_cxx11_((string *)local_2b0,(NamedEntity *)local_e8._0_8_);
        NamedEntity::name_abi_cxx11_
                  (&local_270,
                   (NamedEntity *)
                   local_b0.
                   super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        peVar33 = (element_type *)0xf;
        if ((Entity *)local_2b0._0_8_ != (Entity *)(local_2b0 + 0x10)) {
          peVar33 = (element_type *)local_2b0._16_8_;
        }
        peVar34 = (element_type *)
                  ((long)(_func_int ***)local_2b0._8_8_ +
                  (long)(__shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2> *)
                        local_270._M_string_length);
        if (peVar33 < peVar34) {
          uVar32 = (element_type *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            uVar32 = local_270.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar32 < peVar34) goto LAB_0027dbdf;
          plVar10 = (long *)std::__cxx11::string::replace
                                      ((ulong)&local_270,0,(char *)0x0,local_2b0._0_8_);
        }
        else {
LAB_0027dbdf:
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)local_2b0,(ulong)local_270._M_dataplus._M_p);
        }
        local_2d0._0_8_ = local_2d0 + 0x10;
        pIVar21 = (IdMap *)(plVar10 + 2);
        if ((IdMap *)*plVar10 == pIVar21) {
          local_2d0._16_8_ = *(undefined8 *)&(pIVar21->_M_t)._M_impl;
          local_2d0._24_8_ = plVar10[3];
        }
        else {
          local_2d0._16_8_ = *(undefined8 *)&(pIVar21->_M_t)._M_impl;
          local_2d0._0_8_ = (IdMap *)*plVar10;
        }
        local_2d0._8_8_ = plVar10[1];
        *plVar10 = (long)pIVar21;
        plVar10[1] = 0;
        *(undefined1 *)&(pIVar21->_M_t)._M_impl = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,
                          (ulong)(local_270.field_2._M_allocated_capacity + 1));
        }
        if ((Entity *)local_2b0._0_8_ != (Entity *)(local_2b0 + 0x10)) {
          operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
        }
        Variable::equivalenceMappingId_abi_cxx11_
                  ((string *)local_2b0,(Variable *)local_138,(VariablePtr *)local_e8,
                   (VariablePtr *)pIVar21);
        uVar5 = local_290._8_8_;
        uVar32 = local_2d0._8_8_;
        p_Var27 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290._8_8_;
        if ((ulong)local_2d0._8_8_ < (ulong)local_290._8_8_) {
          p_Var27 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0._8_8_;
        }
        if (p_Var27 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0027dcbb:
          lVar28 = uVar5 - uVar32;
          if (lVar28 < -0x7fffffff) {
            lVar28 = -0x80000000;
          }
          if (0x7ffffffe < lVar28) {
            lVar28 = 0x7fffffff;
          }
          iVar9 = (int)lVar28;
        }
        else {
          iVar9 = memcmp((void *)local_290._0_8_,(void *)local_2d0._0_8_,(size_t)p_Var27);
          if (iVar9 == 0) goto LAB_0027dcbb;
        }
        if ((iVar9 < 0) &&
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          NamedEntity::name_abi_cxx11_((string *)(local_e8 + 0x10),(NamedEntity *)local_138._0_8_);
          plVar10 = (long *)std::__cxx11::string::replace
                                      ((ulong)(local_e8 + 0x10),0,(char *)0x0,0x2a93fb);
          local_160.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &local_150;
          peVar22 = (element_type *)(plVar10 + 2);
          if ((element_type *)*plVar10 == peVar22) {
            local_150._vptr_Issue = peVar22->_vptr_Issue;
            local_150.mPimpl = (IssueImpl *)plVar10[3];
          }
          else {
            local_150._vptr_Issue = peVar22->_vptr_Issue;
            local_160.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar10;
          }
          local_160.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar10[1];
          *plVar10 = (long)peVar22;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_160);
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          puVar23 = (ulong *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar23) {
            local_180.field_2._M_allocated_capacity = *puVar23;
            local_180.field_2._8_8_ = plVar10[3];
          }
          else {
            local_180.field_2._M_allocated_capacity = *puVar23;
            local_180._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_180._M_string_length = plVar10[1];
          *plVar10 = (long)puVar23;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          NamedEntity::name_abi_cxx11_
                    (&local_108,
                     (NamedEntity *)
                     ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                     &local_230->super_Logger)->_M_ptr);
          uVar32 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            uVar32 = local_180.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar32 < local_108._M_string_length + local_180._M_string_length) {
            uVar32 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              uVar32 = local_108.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar32 < local_108._M_string_length + local_180._M_string_length)
            goto LAB_0027de68;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_108,0,(char *)0x0,(ulong)local_180._M_dataplus._M_p);
          }
          else {
LAB_0027de68:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_180,(ulong)local_108._M_dataplus._M_p);
          }
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          puVar23 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar23) {
            local_1e8.field_2._M_allocated_capacity = *puVar23;
            local_1e8.field_2._8_8_ = puVar11[3];
          }
          else {
            local_1e8.field_2._M_allocated_capacity = *puVar23;
            local_1e8._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_1e8._M_string_length = puVar11[1];
          *puVar11 = puVar23;
          puVar11[1] = 0;
          *(undefined1 *)puVar23 = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_1e8);
          puVar23 = (ulong *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar23) {
            local_1c8.field_2._M_allocated_capacity = *puVar23;
            local_1c8.field_2._8_8_ = plVar10[3];
            local_1c8._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_1c8.field_2._M_allocated_capacity = *puVar23;
            local_1c8._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_1c8._M_string_length = plVar10[1];
          *plVar10 = (long)puVar23;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          NamedEntity::name_abi_cxx11_(&local_a0,(NamedEntity *)local_e8._0_8_);
          uVar32 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != paVar3) {
            uVar32 = local_1c8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar32 < local_a0._M_string_length + local_1c8._M_string_length) {
            uVar32 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              uVar32 = local_a0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar32 < local_a0._M_string_length + local_1c8._M_string_length)
            goto LAB_0027dfb1;
            plVar10 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_a0,0,(char *)0x0,
                                         (ulong)local_1c8._M_dataplus._M_p);
          }
          else {
LAB_0027dfb1:
            plVar10 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_1c8,(ulong)local_a0._M_dataplus._M_p);
          }
          local_208._0_8_ = local_208 + 0x10;
          pVVar31 = (ValidatorImpl *)(plVar10 + 2);
          if ((ValidatorImpl *)*plVar10 == pVVar31) {
            local_208._16_8_ =
                 (pVVar31->super_LoggerImpl).mErrors.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_208._24_8_ = plVar10[3];
          }
          else {
            local_208._16_8_ =
                 (pVVar31->super_LoggerImpl).mErrors.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_208._0_8_ = (ValidatorImpl *)*plVar10;
          }
          local_208._8_8_ = plVar10[1];
          *plVar10 = (long)pVVar31;
          plVar10[1] = 0;
          *(undefined1 *)
           &(pVVar31->super_LoggerImpl).mErrors.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = 0;
          plVar10 = (long *)std::__cxx11::string::append(local_208);
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          plVar24 = plVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar24) {
            local_228.field_2._M_allocated_capacity = *plVar24;
            local_228.field_2._8_8_ = plVar10[3];
          }
          else {
            local_228.field_2._M_allocated_capacity = *plVar24;
            local_228._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_228._M_string_length = plVar10[1];
          *plVar10 = (long)plVar24;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          NamedEntity::name_abi_cxx11_
                    ((string *)(local_138 + 0x10),
                     (NamedEntity *)
                     local_b0.
                     super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          uVar32 = (element_type *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            uVar32 = local_228.field_2._M_allocated_capacity;
          }
          peVar2 = (element_type *)
                   ((long)(_func_int ***)local_228._M_string_length +
                   (long)&(local_120._M_pi)->_vptr__Sp_counted_base);
          if ((ulong)uVar32 < peVar2) {
            uVar32 = (element_type *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._16_8_ != &local_118) {
              uVar32 = local_118._M_allocated_capacity;
            }
            if ((ulong)uVar32 < peVar2) goto LAB_0027e108;
            plVar10 = (long *)std::__cxx11::string::replace
                                        ((ulong)(local_138 + 0x10),0,(char *)0x0,
                                         (ulong)local_228._M_dataplus._M_p);
          }
          else {
LAB_0027e108:
            plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_228,local_138._16_8_);
          }
          pVVar31 = (ValidatorImpl *)(plVar10 + 2);
          if ((ValidatorImpl *)*plVar10 == pVVar31) {
            local_250._16_8_ =
                 (pVVar31->super_LoggerImpl).mErrors.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_250._24_8_ = plVar10[3];
            local_250._0_8_ = (ValidatorImpl *)(local_250 + 0x10);
          }
          else {
            local_250._16_8_ =
                 (pVVar31->super_LoggerImpl).mErrors.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_250._0_8_ = (ValidatorImpl *)*plVar10;
          }
          local_250._8_8_ = plVar10[1];
          *plVar10 = (long)pVVar31;
          plVar10[1] = 0;
          *(undefined1 *)
           &(pVVar31->super_LoggerImpl).mErrors.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append(local_250);
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          puVar18 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar18) {
            local_270.field_2._M_allocated_capacity = *puVar18;
            local_270.field_2._8_8_ = puVar11[3];
          }
          else {
            local_270.field_2._M_allocated_capacity = *puVar18;
            local_270._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_270._M_string_length = puVar11[1];
          *puVar11 = puVar18;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          if ((ValidatorImpl *)local_250._0_8_ != (ValidatorImpl *)(local_250 + 0x10)) {
            operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._16_8_ != &local_118) {
            operator_delete((void *)local_138._16_8_,(ulong)(local_118._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,
                            (ulong)(local_228.field_2._M_allocated_capacity + 1));
          }
          if ((ValidatorImpl *)local_208._0_8_ != (ValidatorImpl *)(local_208 + 0x10)) {
            operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != paVar3) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          if (local_160.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_150) {
            operator_delete(local_160.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (long)local_150._vptr_Issue + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._16_8_ != &local_c8) {
            operator_delete((void *)local_e8._16_8_,(ulong)(local_c8._M_allocated_capacity + 1));
          }
          bVar8 = isValidXmlName((string *)local_2b0);
          if (!bVar8) {
            Issue::IssueImpl::create();
            Issue::IssueImpl::setReferenceRule
                      (*(IssueImpl **)(local_1e8._M_dataplus._M_p + 8),XML_ID_ATTRIBUTE);
            AnyCellmlElement::AnyCellmlElementImpl::setMapVariables
                      ((AnyCellmlElementImpl *)
                       **(undefined8 **)(*(long *)(local_1e8._M_dataplus._M_p + 8) + 0x28),
                       (VariablePtr *)local_138,(VariablePtr *)local_e8);
            pIVar4 = *(IssueImpl **)(local_1e8._M_dataplus._M_p + 8);
            std::operator+(&local_1c8,"Variable equivalence ",&local_270);
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_1c8);
            local_208._0_8_ = local_208 + 0x10;
            pVVar31 = (ValidatorImpl *)(plVar10 + 2);
            if ((ValidatorImpl *)*plVar10 == pVVar31) {
              local_208._16_8_ =
                   (pVVar31->super_LoggerImpl).mErrors.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_208._24_8_ = plVar10[3];
            }
            else {
              local_208._16_8_ =
                   (pVVar31->super_LoggerImpl).mErrors.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_208._0_8_ = (ValidatorImpl *)*plVar10;
            }
            local_208._8_8_ = plVar10[1];
            *plVar10 = (long)pVVar31;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::_M_append(local_208,local_2b0._0_8_);
            local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
            plVar24 = plVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar24) {
              local_228.field_2._M_allocated_capacity = *plVar24;
              local_228.field_2._8_8_ = plVar10[3];
            }
            else {
              local_228.field_2._M_allocated_capacity = *plVar24;
              local_228._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_228._M_string_length = plVar10[1];
            *plVar10 = (long)plVar24;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_228);
            local_250._0_8_ = local_250 + 0x10;
            pVVar31 = (ValidatorImpl *)(plVar10 + 2);
            if ((ValidatorImpl *)*plVar10 == pVVar31) {
              local_250._16_8_ =
                   (pVVar31->super_LoggerImpl).mErrors.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_250._24_8_ = plVar10[3];
            }
            else {
              local_250._16_8_ =
                   (pVVar31->super_LoggerImpl).mErrors.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_250._0_8_ = (ValidatorImpl *)*plVar10;
            }
            local_250._8_8_ = plVar10[1];
            *plVar10 = (long)pVVar31;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            Issue::IssueImpl::setDescription(pIVar4,(string *)local_250);
            if ((ValidatorImpl *)local_250._0_8_ != (ValidatorImpl *)(local_250 + 0x10)) {
              operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,
                              (ulong)(local_228.field_2._M_allocated_capacity + 1));
            }
            if ((ValidatorImpl *)local_208._0_8_ != (ValidatorImpl *)(local_208 + 0x10)) {
              operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != paVar3) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            Logger::LoggerImpl::addIssue(&local_140->super_LoggerImpl,(IssuePtr *)&local_1e8);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._M_string_length)
              ;
            }
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_250," - variable equivalence ",&local_270);
          std::__cxx11::string::operator=((string *)&local_1a0,(string *)local_250);
          pVVar31 = (ValidatorImpl *)local_250._0_8_;
          if ((ValidatorImpl *)local_250._0_8_ != (ValidatorImpl *)(local_250 + 0x10)) {
            operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
          }
          pIVar21 = local_1a8;
          addIdMapItem(pVVar31,(string *)local_2b0,&local_1a0,local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,
                            (ulong)(local_270.field_2._M_allocated_capacity + 1));
          }
        }
        Variable::equivalenceConnectionId_abi_cxx11_
                  (&local_270,(Variable *)local_138,(VariablePtr *)local_e8,(VariablePtr *)pIVar21);
        NamedEntity::name_abi_cxx11_
                  (&local_228,
                   (NamedEntity *)
                   ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_230->super_Logger)->_M_ptr);
        NamedEntity::name_abi_cxx11_
                  ((string *)local_208,
                   (NamedEntity *)
                   local_b0.
                   super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        uVar32 = local_208._8_8_;
        sVar6 = local_228._M_string_length;
        p_Var27 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._M_string_length;
        if ((ulong)local_208._8_8_ < local_228._M_string_length) {
          p_Var27 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_;
        }
        if (p_Var27 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0027e6d4:
          lVar28 = sVar6 - uVar32;
          if (lVar28 < -0x7fffffff) {
            lVar28 = -0x80000000;
          }
          if (0x7ffffffe < lVar28) {
            lVar28 = 0x7fffffff;
          }
          iVar9 = (int)lVar28;
        }
        else {
          iVar9 = memcmp(local_228._M_dataplus._M_p,(void *)local_208._0_8_,(size_t)p_Var27);
          if (iVar9 == 0) goto LAB_0027e6d4;
        }
        if (iVar9 < 0) {
          NamedEntity::name_abi_cxx11_
                    (&local_1c8,
                     (NamedEntity *)
                     ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                     &local_230->super_Logger)->_M_ptr);
          NamedEntity::name_abi_cxx11_
                    (&local_1e8,
                     (NamedEntity *)
                     local_b0.
                     super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          uVar32 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != paVar3) {
            uVar32 = local_1c8.field_2._M_allocated_capacity;
          }
          uVar26 = (long)(_func_int ***)local_1e8._M_string_length + local_1c8._M_string_length;
          if ((ulong)uVar32 < uVar26) {
            uVar32 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              uVar32 = local_1e8.field_2._M_allocated_capacity;
            }
            if (uVar26 <= (ulong)uVar32) {
              plVar10 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_1e8,0,(char *)0x0,
                                           (ulong)local_1c8._M_dataplus._M_p);
              goto LAB_0027e870;
            }
          }
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_1c8,(ulong)local_1e8._M_dataplus._M_p);
        }
        else {
          NamedEntity::name_abi_cxx11_
                    (&local_1c8,
                     (NamedEntity *)
                     local_b0.
                     super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          NamedEntity::name_abi_cxx11_
                    (&local_1e8,
                     (NamedEntity *)
                     ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                     &local_230->super_Logger)->_M_ptr);
          uVar32 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != paVar3) {
            uVar32 = local_1c8.field_2._M_allocated_capacity;
          }
          uVar26 = (long)(_func_int ***)local_1e8._M_string_length + local_1c8._M_string_length;
          if ((ulong)uVar32 < uVar26) {
            uVar32 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              uVar32 = local_1e8.field_2._M_allocated_capacity;
            }
            if (uVar26 <= (ulong)uVar32) {
              plVar10 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_1e8,0,(char *)0x0,
                                           (ulong)local_1c8._M_dataplus._M_p);
              goto LAB_0027e870;
            }
          }
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_1c8,(ulong)local_1e8._M_dataplus._M_p);
        }
LAB_0027e870:
        local_250._0_8_ = local_250 + 0x10;
        pVVar31 = (ValidatorImpl *)(plVar10 + 2);
        if ((ValidatorImpl *)*plVar10 == pVVar31) {
          local_250._16_8_ =
               (pVVar31->super_LoggerImpl).mErrors.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_250._24_8_ = plVar10[3];
        }
        else {
          local_250._16_8_ =
               (pVVar31->super_LoggerImpl).mErrors.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_250._0_8_ = (ValidatorImpl *)*plVar10;
        }
        local_250._8_8_ = plVar10[1];
        *plVar10 = (long)pVVar31;
        plVar10[1] = 0;
        *(undefined1 *)
         &(pVVar31->super_LoggerImpl).mErrors.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != paVar3) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((ValidatorImpl *)local_208._0_8_ != (ValidatorImpl *)(local_208 + 0x10)) {
          operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,
                          (ulong)(local_228.field_2._M_allocated_capacity + 1));
        }
        uVar5 = local_290._8_8_;
        uVar32 = local_2d0._8_8_;
        p_Var27 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290._8_8_;
        if ((ulong)local_2d0._8_8_ < (ulong)local_290._8_8_) {
          p_Var27 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0._8_8_;
        }
        if (p_Var27 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0027e978:
          lVar28 = uVar5 - uVar32;
          if (lVar28 < -0x7fffffff) {
            lVar28 = -0x80000000;
          }
          if (0x7ffffffe < lVar28) {
            lVar28 = 0x7fffffff;
          }
          iVar9 = (int)lVar28;
        }
        else {
          iVar9 = memcmp((void *)local_290._0_8_,(void *)local_2d0._0_8_,(size_t)p_Var27);
          if (iVar9 == 0) goto LAB_0027e978;
        }
        if ((iVar9 < 0) && ((pointer)local_270._M_string_length != (pointer)0x0)) {
          cVar13 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_b8,(key_type *)local_250);
          if (cVar13._M_node == local_38) {
            NamedEntity::name_abi_cxx11_
                      (&local_a0,
                       (NamedEntity *)
                       ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                       &local_230->super_Logger)->_M_ptr);
            plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x2a9475)
            ;
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            puVar23 = (ulong *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar23) {
              local_108.field_2._M_allocated_capacity = *puVar23;
              local_108.field_2._8_8_ = plVar10[3];
            }
            else {
              local_108.field_2._M_allocated_capacity = *puVar23;
              local_108._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_108._M_string_length = plVar10[1];
            *plVar10 = (long)puVar23;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_108);
            local_e8._16_8_ = &local_c8;
            paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 == paVar25) {
              local_c8._M_allocated_capacity = paVar25->_M_allocated_capacity;
              local_c8._8_8_ = plVar10[3];
            }
            else {
              local_c8._M_allocated_capacity = paVar25->_M_allocated_capacity;
              local_e8._16_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar10;
            }
            local_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar10[1];
            *plVar10 = (long)paVar25;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            NamedEntity::name_abi_cxx11_
                      ((string *)(local_138 + 0x10),
                       (NamedEntity *)
                       local_b0.
                       super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
            uVar32 = (element_type *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._16_8_ != &local_c8) {
              uVar32 = local_c8._M_allocated_capacity;
            }
            peVar2 = (element_type *)
                     ((long)&(local_d0._M_pi)->_vptr__Sp_counted_base +
                     (long)&(local_120._M_pi)->_vptr__Sp_counted_base);
            if ((ulong)uVar32 < peVar2) {
              uVar32 = (element_type *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._16_8_ != &local_118) {
                uVar32 = local_118._M_allocated_capacity;
              }
              if ((ulong)uVar32 < peVar2) goto LAB_0027eb48;
              plVar10 = (long *)std::__cxx11::string::replace
                                          ((ulong)(local_138 + 0x10),0,(char *)0x0,local_e8._16_8_);
            }
            else {
LAB_0027eb48:
              plVar10 = (long *)std::__cxx11::string::_M_append(local_e8 + 0x10,local_138._16_8_);
            }
            local_160.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 &local_150;
            peVar22 = (element_type *)(plVar10 + 2);
            if ((element_type *)*plVar10 == peVar22) {
              local_150._vptr_Issue = peVar22->_vptr_Issue;
              local_150.mPimpl = (IssueImpl *)plVar10[3];
            }
            else {
              local_150._vptr_Issue = peVar22->_vptr_Issue;
              local_160.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)*plVar10;
            }
            local_160.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar10[1];
            *plVar10 = (long)peVar22;
            plVar10[1] = 0;
            *(undefined1 *)&peVar22->_vptr_Issue = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_160);
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            puVar23 = (ulong *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar23) {
              local_180.field_2._M_allocated_capacity = *puVar23;
              local_180.field_2._8_8_ = plVar10[3];
            }
            else {
              local_180.field_2._M_allocated_capacity = *puVar23;
              local_180._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_180._M_string_length = plVar10[1];
            *plVar10 = (long)puVar23;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            NamedEntity::name_abi_cxx11_(&local_60,(NamedEntity *)local_138._0_8_);
            uVar32 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              uVar32 = local_180.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar32 < local_60._M_string_length + local_180._M_string_length) {
              uVar32 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                uVar32 = local_60.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar32 < local_60._M_string_length + local_180._M_string_length)
              goto LAB_0027ec9f;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_60,0,(char *)0x0,(ulong)local_180._M_dataplus._M_p)
              ;
            }
            else {
LAB_0027ec9f:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_180,(ulong)local_60._M_dataplus._M_p);
            }
            local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
            puVar23 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar23) {
              local_1e8.field_2._M_allocated_capacity = *puVar23;
              local_1e8.field_2._8_8_ = puVar11[3];
            }
            else {
              local_1e8.field_2._M_allocated_capacity = *puVar23;
              local_1e8._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_1e8._M_string_length = puVar11[1];
            *puVar11 = puVar23;
            puVar11[1] = 0;
            *(undefined1 *)puVar23 = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_1e8);
            puVar23 = (ulong *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar23) {
              local_1c8.field_2._M_allocated_capacity = *puVar23;
              local_1c8.field_2._8_8_ = plVar10[3];
              local_1c8._M_dataplus._M_p = (pointer)paVar3;
            }
            else {
              local_1c8.field_2._M_allocated_capacity = *puVar23;
              local_1c8._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_1c8._M_string_length = plVar10[1];
            *plVar10 = (long)puVar23;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            NamedEntity::name_abi_cxx11_(&local_80,(NamedEntity *)local_e8._0_8_);
            uVar32 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != paVar3) {
              uVar32 = local_1c8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar32 < local_80._M_string_length + local_1c8._M_string_length) {
              uVar32 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                uVar32 = local_80.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar32 < local_80._M_string_length + local_1c8._M_string_length)
              goto LAB_0027ede8;
              plVar10 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_80,0,(char *)0x0,
                                           (ulong)local_1c8._M_dataplus._M_p);
            }
            else {
LAB_0027ede8:
              plVar10 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_1c8,(ulong)local_80._M_dataplus._M_p);
            }
            local_208._0_8_ = local_208 + 0x10;
            pVVar31 = (ValidatorImpl *)(plVar10 + 2);
            if ((ValidatorImpl *)*plVar10 == pVVar31) {
              local_208._16_8_ =
                   (pVVar31->super_LoggerImpl).mErrors.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_208._24_8_ = plVar10[3];
            }
            else {
              local_208._16_8_ =
                   (pVVar31->super_LoggerImpl).mErrors.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_208._0_8_ = (ValidatorImpl *)*plVar10;
            }
            local_208._8_8_ = plVar10[1];
            *plVar10 = (long)pVVar31;
            plVar10[1] = 0;
            *(undefined1 *)
             &(pVVar31->super_LoggerImpl).mErrors.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = 0;
            plVar10 = (long *)std::__cxx11::string::append(local_208);
            local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
            plVar24 = plVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar24) {
              local_228.field_2._M_allocated_capacity = *plVar24;
              local_228.field_2._8_8_ = plVar10[3];
            }
            else {
              local_228.field_2._M_allocated_capacity = *plVar24;
              local_228._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_228._M_string_length = plVar10[1];
            *plVar10 = (long)plVar24;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            if ((ValidatorImpl *)local_208._0_8_ != (ValidatorImpl *)(local_208 + 0x10)) {
              operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != paVar3) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_160.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                &local_150) {
              operator_delete(local_160.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,(long)local_150._vptr_Issue + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._16_8_ != &local_118) {
              operator_delete((void *)local_138._16_8_,(ulong)(local_118._M_allocated_capacity + 1))
              ;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._16_8_ != &local_c8) {
              operator_delete((void *)local_e8._16_8_,(ulong)(local_c8._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            bVar8 = isValidXmlName(&local_270);
            if (!bVar8) {
              Issue::IssueImpl::create();
              Issue::IssueImpl::setReferenceRule
                        ((local_160.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,XML_ID_ATTRIBUTE);
              AnyCellmlElement::AnyCellmlElementImpl::setConnection
                        ((((local_160.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->mPimpl->mItem).
                          super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,(VariablePtr *)local_138,(VariablePtr *)local_e8);
              pIVar4 = (local_160.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl;
              std::operator+(&local_180,"Connection ",&local_228);
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
              local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
              puVar23 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar23) {
                local_1e8.field_2._M_allocated_capacity = *puVar23;
                local_1e8.field_2._8_8_ = puVar11[3];
              }
              else {
                local_1e8.field_2._M_allocated_capacity = *puVar23;
                local_1e8._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_1e8._M_string_length = puVar11[1];
              *puVar11 = puVar23;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_1e8,(ulong)local_270._M_dataplus._M_p);
              puVar23 = (ulong *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar23) {
                local_1c8.field_2._M_allocated_capacity = *puVar23;
                local_1c8.field_2._8_8_ = plVar10[3];
                local_1c8._M_dataplus._M_p = (pointer)paVar3;
              }
              else {
                local_1c8.field_2._M_allocated_capacity = *puVar23;
                local_1c8._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_1c8._M_string_length = plVar10[1];
              *plVar10 = (long)puVar23;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_1c8);
              local_208._0_8_ = local_208 + 0x10;
              pVVar31 = (ValidatorImpl *)(plVar10 + 2);
              if ((ValidatorImpl *)*plVar10 == pVVar31) {
                local_208._16_8_ =
                     (pVVar31->super_LoggerImpl).mErrors.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_208._24_8_ = plVar10[3];
              }
              else {
                local_208._16_8_ =
                     (pVVar31->super_LoggerImpl).mErrors.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_208._0_8_ = (ValidatorImpl *)*plVar10;
              }
              local_208._8_8_ = plVar10[1];
              *plVar10 = (long)pVVar31;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              Issue::IssueImpl::setDescription(pIVar4,(string *)local_208);
              if ((ValidatorImpl *)local_208._0_8_ != (ValidatorImpl *)(local_208 + 0x10)) {
                operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p != paVar3) {
                operator_delete(local_1c8._M_dataplus._M_p,
                                local_1c8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              Logger::LoggerImpl::addIssue(&local_140->super_LoggerImpl,&local_160);
              if (local_160.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_160.
                           super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
            }
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      (local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_250);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_208," - connection ",&local_228);
            std::__cxx11::string::operator=((string *)&local_1a0,(string *)local_208);
            pVVar31 = (ValidatorImpl *)local_208._0_8_;
            if ((ValidatorImpl *)local_208._0_8_ != (ValidatorImpl *)(local_208 + 0x10)) {
              operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
            }
            addIdMapItem(pVVar31,&local_270,&local_1a0,local_1a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,
                              (ulong)(local_228.field_2._M_allocated_capacity + 1));
            }
          }
        }
        if ((ValidatorImpl *)local_250._0_8_ != (ValidatorImpl *)(local_250 + 0x10)) {
          operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,
                          (ulong)(local_270.field_2._M_allocated_capacity + 1));
        }
        if ((Entity *)local_2b0._0_8_ != (Entity *)(local_2b0 + 0x10)) {
          operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
        }
        if ((IdMap *)local_2d0._0_8_ != (IdMap *)(local_2d0 + 0x10)) {
          operator_delete((void *)local_2d0._0_8_,(ulong)(local_2d0._16_8_ + 1));
        }
        if ((NamedEntity *)local_290._0_8_ != (NamedEntity *)(local_290 + 0x10)) {
          operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
        }
      }
      if (local_b0.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.
                   super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
      }
      uVar35 = uVar35 + 1;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
    }
    uVar35 = local_40 + 1;
  }
  uVar35 = 0;
  while( true ) {
    pcVar37 = local_290 + 0x10;
    sVar12 = Component::resetCount
                       (((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                        &local_230->super_Logger)->_M_ptr);
    if (sVar12 <= uVar35) break;
    Component::reset((Component *)local_208,
                     (size_t)((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                             &local_230->super_Logger)->_M_ptr);
    Entity::id_abi_cxx11_((string *)local_290,(Entity *)local_208._0_8_);
    uVar32 = local_290._8_8_;
    if ((NamedEntity *)local_290._0_8_ != (NamedEntity *)(local_290 + 0x10)) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    pNVar36 = (NamedEntity *)(local_290 + 0x10);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      cVar29 = '\x01';
      if (9 < uVar35) {
        uVar26 = uVar35;
        cVar7 = '\x04';
        do {
          cVar29 = cVar7;
          if (uVar26 < 100) {
            cVar29 = cVar29 + -2;
            goto LAB_0027f53f;
          }
          if (uVar26 < 1000) {
            cVar29 = cVar29 + -1;
            goto LAB_0027f53f;
          }
          if (uVar26 < 10000) goto LAB_0027f53f;
          bVar8 = 99999 < uVar26;
          uVar26 = uVar26 / 10000;
          cVar7 = cVar29 + '\x04';
        } while (bVar8);
        cVar29 = cVar29 + '\x01';
      }
LAB_0027f53f:
      local_250._0_8_ = local_250 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_250,cVar29);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_250._0_8_,local_250._8_4_,uVar35);
      puVar11 = (undefined8 *)std::__cxx11::string::replace((ulong)local_250,0,(char *)0x0,0x2a9510)
      ;
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      puVar18 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar18) {
        local_270.field_2._M_allocated_capacity = *puVar18;
        local_270.field_2._8_8_ = puVar11[3];
      }
      else {
        local_270.field_2._M_allocated_capacity = *puVar18;
        local_270._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_270._M_string_length = puVar11[1];
      *puVar11 = puVar18;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_270);
      local_2b0._0_8_ = local_2b0 + 0x10;
      pEVar19 = (Entity *)(plVar10 + 2);
      if ((Entity *)*plVar10 == pEVar19) {
        local_2b0._16_8_ = pEVar19->_vptr_Entity;
        local_2b0._24_8_ = plVar10[3];
      }
      else {
        local_2b0._16_8_ = pEVar19->_vptr_Entity;
        local_2b0._0_8_ = (Entity *)*plVar10;
      }
      local_2b0._8_8_ = plVar10[1];
      *plVar10 = (long)pEVar19;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      NamedEntity::name_abi_cxx11_
                (&local_228,
                 (NamedEntity *)
                 ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_230->super_Logger)->_M_ptr);
      peVar33 = (element_type *)0xf;
      if ((Entity *)local_2b0._0_8_ != (Entity *)(local_2b0 + 0x10)) {
        peVar33 = (element_type *)local_2b0._16_8_;
      }
      peVar34 = (element_type *)
                ((long)(_func_int ***)local_2b0._8_8_ +
                (long)(_func_int ***)local_228._M_string_length);
      if (peVar33 < peVar34) {
        uVar32 = (element_type *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          uVar32 = local_228.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar32 < peVar34) goto LAB_0027f696;
        plVar10 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_228,0,(char *)0x0,local_2b0._0_8_);
      }
      else {
LAB_0027f696:
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    (local_2b0,(ulong)local_228._M_dataplus._M_p);
      }
      local_2d0._0_8_ = local_2d0 + 0x10;
      pIVar21 = (IdMap *)(plVar10 + 2);
      if ((IdMap *)*plVar10 == pIVar21) {
        local_2d0._16_8_ = *(undefined8 *)&(pIVar21->_M_t)._M_impl;
        local_2d0._24_8_ = plVar10[3];
      }
      else {
        local_2d0._16_8_ = *(undefined8 *)&(pIVar21->_M_t)._M_impl;
        local_2d0._0_8_ = (IdMap *)*plVar10;
      }
      local_2d0._8_8_ = plVar10[1];
      *plVar10 = (long)pIVar21;
      plVar10[1] = 0;
      *(undefined1 *)&(pIVar21->_M_t)._M_impl = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_2d0);
      pNVar20 = (NamedEntity *)(plVar10 + 2);
      if ((NamedEntity *)*plVar10 == pNVar20) {
        local_290._16_8_ = (pNVar20->super_ParentedEntity).super_Entity._vptr_Entity;
        local_290._24_8_ = plVar10[3];
        local_290._0_8_ = pNVar36;
      }
      else {
        local_290._16_8_ = (pNVar20->super_ParentedEntity).super_Entity._vptr_Entity;
        local_290._0_8_ = (NamedEntity *)*plVar10;
      }
      local_290._8_8_ = plVar10[1];
      *plVar10 = (long)pNVar20;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_1a0,(string *)local_290);
      if ((NamedEntity *)local_290._0_8_ != pNVar36) {
        operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
      }
      if ((IdMap *)local_2d0._0_8_ != (IdMap *)(local_2d0 + 0x10)) {
        operator_delete((void *)local_2d0._0_8_,(ulong)(local_2d0._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,
                        (ulong)(local_228.field_2._M_allocated_capacity + 1));
      }
      if ((Entity *)local_2b0._0_8_ != (Entity *)(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,
                        (ulong)(local_270.field_2._M_allocated_capacity + 1));
      }
      if ((ValidatorImpl *)local_250._0_8_ != (ValidatorImpl *)(local_250 + 0x10)) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
      }
      pVVar31 = (ValidatorImpl *)local_290;
      Entity::id_abi_cxx11_((string *)local_290,(Entity *)local_208._0_8_);
      addIdMapItem(pVVar31,(string *)local_290,&local_1a0,local_1a8);
      if ((NamedEntity *)local_290._0_8_ != pNVar36) {
        operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
      }
    }
    Reset::testValueId_abi_cxx11_((string *)local_290,(Reset *)local_208._0_8_);
    uVar32 = local_290._8_8_;
    if ((NamedEntity *)local_290._0_8_ != (NamedEntity *)(local_290 + 0x10)) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    pNVar36 = (NamedEntity *)(local_290 + 0x10);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      cVar29 = '\x01';
      if (9 < uVar35) {
        uVar26 = uVar35;
        cVar7 = '\x04';
        do {
          cVar29 = cVar7;
          if (uVar26 < 100) {
            cVar29 = cVar29 + -2;
            goto LAB_0027f8d7;
          }
          if (uVar26 < 1000) {
            cVar29 = cVar29 + -1;
            goto LAB_0027f8d7;
          }
          if (uVar26 < 10000) goto LAB_0027f8d7;
          bVar8 = 99999 < uVar26;
          uVar26 = uVar26 / 10000;
          cVar7 = cVar29 + '\x04';
        } while (bVar8);
        cVar29 = cVar29 + '\x01';
      }
LAB_0027f8d7:
      local_250._0_8_ = local_250 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_250,cVar29);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_250._0_8_,local_250._8_4_,uVar35);
      puVar11 = (undefined8 *)std::__cxx11::string::replace((ulong)local_250,0,(char *)0x0,0x2a9523)
      ;
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      puVar18 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar18) {
        local_270.field_2._M_allocated_capacity = *puVar18;
        local_270.field_2._8_8_ = puVar11[3];
      }
      else {
        local_270.field_2._M_allocated_capacity = *puVar18;
        local_270._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_270._M_string_length = puVar11[1];
      *puVar11 = puVar18;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_270);
      local_2b0._0_8_ = local_2b0 + 0x10;
      pEVar19 = (Entity *)(plVar10 + 2);
      if ((Entity *)*plVar10 == pEVar19) {
        local_2b0._16_8_ = pEVar19->_vptr_Entity;
        local_2b0._24_8_ = plVar10[3];
      }
      else {
        local_2b0._16_8_ = pEVar19->_vptr_Entity;
        local_2b0._0_8_ = (Entity *)*plVar10;
      }
      local_2b0._8_8_ = plVar10[1];
      *plVar10 = (long)pEVar19;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      NamedEntity::name_abi_cxx11_
                (&local_228,
                 (NamedEntity *)
                 ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_230->super_Logger)->_M_ptr);
      peVar33 = (element_type *)0xf;
      if ((Entity *)local_2b0._0_8_ != (Entity *)(local_2b0 + 0x10)) {
        peVar33 = (element_type *)local_2b0._16_8_;
      }
      peVar34 = (element_type *)
                ((long)(_func_int ***)local_2b0._8_8_ +
                (long)(_func_int ***)local_228._M_string_length);
      if (peVar33 < peVar34) {
        uVar32 = (element_type *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          uVar32 = local_228.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar32 < peVar34) goto LAB_0027fa2e;
        plVar10 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_228,0,(char *)0x0,local_2b0._0_8_);
      }
      else {
LAB_0027fa2e:
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    (local_2b0,(ulong)local_228._M_dataplus._M_p);
      }
      local_2d0._0_8_ = local_2d0 + 0x10;
      pIVar21 = (IdMap *)(plVar10 + 2);
      if ((IdMap *)*plVar10 == pIVar21) {
        local_2d0._16_8_ = *(undefined8 *)&(pIVar21->_M_t)._M_impl;
        local_2d0._24_8_ = plVar10[3];
      }
      else {
        local_2d0._16_8_ = *(undefined8 *)&(pIVar21->_M_t)._M_impl;
        local_2d0._0_8_ = (IdMap *)*plVar10;
      }
      local_2d0._8_8_ = plVar10[1];
      *plVar10 = (long)pIVar21;
      plVar10[1] = 0;
      *(undefined1 *)&(pIVar21->_M_t)._M_impl = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_2d0);
      pNVar20 = (NamedEntity *)(plVar10 + 2);
      if ((NamedEntity *)*plVar10 == pNVar20) {
        local_290._16_8_ = (pNVar20->super_ParentedEntity).super_Entity._vptr_Entity;
        local_290._24_8_ = plVar10[3];
        local_290._0_8_ = pNVar36;
      }
      else {
        local_290._16_8_ = (pNVar20->super_ParentedEntity).super_Entity._vptr_Entity;
        local_290._0_8_ = (NamedEntity *)*plVar10;
      }
      local_290._8_8_ = plVar10[1];
      *plVar10 = (long)pNVar20;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_1a0,(string *)local_290);
      if ((NamedEntity *)local_290._0_8_ != pNVar36) {
        operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
      }
      if ((IdMap *)local_2d0._0_8_ != (IdMap *)(local_2d0 + 0x10)) {
        operator_delete((void *)local_2d0._0_8_,(ulong)(local_2d0._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,
                        (ulong)(local_228.field_2._M_allocated_capacity + 1));
      }
      if ((Entity *)local_2b0._0_8_ != (Entity *)(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,
                        (ulong)(local_270.field_2._M_allocated_capacity + 1));
      }
      if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
      }
      pVVar31 = (ValidatorImpl *)local_290;
      Reset::testValueId_abi_cxx11_((string *)local_290,(Reset *)local_208._0_8_);
      addIdMapItem(pVVar31,(string *)local_290,&local_1a0,local_1a8);
      if ((NamedEntity *)local_290._0_8_ != pNVar36) {
        operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
      }
    }
    cVar29 = '\x01';
    if (9 < uVar35) {
      uVar26 = uVar35;
      cVar7 = '\x04';
      do {
        cVar29 = cVar7;
        if (uVar26 < 100) {
          cVar29 = cVar29 + -2;
          goto LAB_0027fc30;
        }
        if (uVar26 < 1000) {
          cVar29 = cVar29 + -1;
          goto LAB_0027fc30;
        }
        if (uVar26 < 10000) goto LAB_0027fc30;
        bVar8 = 99999 < uVar26;
        uVar26 = uVar26 / 10000;
        cVar7 = cVar29 + '\x04';
      } while (bVar8);
      cVar29 = cVar29 + '\x01';
    }
LAB_0027fc30:
    local_250._0_8_ = local_250 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_250,cVar29);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_250._0_8_,local_250._8_4_,uVar35)
    ;
    plVar10 = (long *)std::__cxx11::string::replace((ulong)local_250,0,(char *)0x0,0x2a9544);
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    psVar14 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_270.field_2._M_allocated_capacity = *psVar14;
      local_270.field_2._8_8_ = plVar10[3];
    }
    else {
      local_270.field_2._M_allocated_capacity = *psVar14;
      local_270._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_270._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_270);
    local_2b0._0_8_ = local_2b0 + 0x10;
    peVar15 = (element_type *)(plVar10 + 2);
    if ((element_type *)*plVar10 == peVar15) {
      local_2b0._16_8_ = (peVar15->super_Entity)._vptr_Entity;
      local_2b0._24_8_ = plVar10[3];
    }
    else {
      local_2b0._16_8_ = (peVar15->super_Entity)._vptr_Entity;
      local_2b0._0_8_ = (element_type *)*plVar10;
    }
    local_2b0._8_8_ = plVar10[1];
    *plVar10 = (long)peVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    NamedEntity::name_abi_cxx11_
              (&local_228,
               (NamedEntity *)
               ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
               &local_230->super_Logger)->_M_ptr);
    peVar33 = (element_type *)0xf;
    if ((element_type *)local_2b0._0_8_ != (element_type *)(local_2b0 + 0x10)) {
      peVar33 = (element_type *)local_2b0._16_8_;
    }
    peVar34 = (element_type *)
              ((long)(_func_int ***)local_2b0._8_8_ +
              (long)(_func_int ***)local_228._M_string_length);
    if (peVar33 < peVar34) {
      uVar32 = (element_type *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        uVar32 = local_228.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar32 < peVar34) goto LAB_0027fd87;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,local_2b0._0_8_);
    }
    else {
LAB_0027fd87:
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append(local_2b0,(ulong)local_228._M_dataplus._M_p);
    }
    local_2d0._0_8_ = local_2d0 + 0x10;
    psVar14 = puVar11 + 2;
    if ((size_type *)*puVar11 == psVar14) {
      local_2d0._16_8_ = *psVar14;
      local_2d0._24_8_ = puVar11[3];
    }
    else {
      local_2d0._16_8_ = *psVar14;
      local_2d0._0_8_ = (size_type *)*puVar11;
    }
    local_2d0._8_8_ = puVar11[1];
    *puVar11 = psVar14;
    puVar11[1] = 0;
    *(undefined1 *)psVar14 = 0;
    plVar10 = (long *)std::__cxx11::string::append(local_2d0);
    pNVar20 = (NamedEntity *)(plVar10 + 2);
    if ((NamedEntity *)*plVar10 == pNVar20) {
      local_290._16_8_ = (pNVar20->super_ParentedEntity).super_Entity._vptr_Entity;
      local_290._24_8_ = plVar10[3];
      local_290._0_8_ = pNVar36;
    }
    else {
      local_290._16_8_ = (pNVar20->super_ParentedEntity).super_Entity._vptr_Entity;
      local_290._0_8_ = (NamedEntity *)*plVar10;
    }
    local_290._8_8_ = plVar10[1];
    *plVar10 = (long)pNVar20;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a0,(string *)local_290);
    if ((NamedEntity *)local_290._0_8_ != pNVar36) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
      operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,
                      (ulong)(local_228.field_2._M_allocated_capacity + 1));
    }
    if ((element_type *)local_2b0._0_8_ != (element_type *)(local_2b0 + 0x10)) {
      operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
      operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
    }
    Reset::testValue_abi_cxx11_((string *)local_290,(Reset *)local_208._0_8_);
    buildMathIdMap(local_140,&local_1a0,local_1a8,(string *)local_290);
    if ((NamedEntity *)local_290._0_8_ != pNVar36) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    Reset::resetValueId_abi_cxx11_((string *)local_290,(Reset *)local_208._0_8_);
    uVar32 = local_290._8_8_;
    if ((NamedEntity *)local_290._0_8_ != (NamedEntity *)(local_290 + 0x10)) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    pNVar36 = (NamedEntity *)(local_290 + 0x10);
    if ((EntityImpl *)uVar32 != (EntityImpl *)0x0) {
      cVar29 = '\x01';
      if (9 < uVar35) {
        uVar26 = uVar35;
        cVar7 = '\x04';
        do {
          cVar29 = cVar7;
          if (uVar26 < 100) {
            cVar29 = cVar29 + -2;
            goto LAB_0027ffd0;
          }
          if (uVar26 < 1000) {
            cVar29 = cVar29 + -1;
            goto LAB_0027ffd0;
          }
          if (uVar26 < 10000) goto LAB_0027ffd0;
          bVar8 = 99999 < uVar26;
          uVar26 = uVar26 / 10000;
          cVar7 = cVar29 + '\x04';
        } while (bVar8);
        cVar29 = cVar29 + '\x01';
      }
LAB_0027ffd0:
      local_250._0_8_ = local_250 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_250,cVar29);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_250._0_8_,local_250._8_4_,uVar35);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)local_250,0,(char *)0x0,0x2a9559);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      psVar14 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_270.field_2._M_allocated_capacity = *psVar14;
        local_270.field_2._8_8_ = plVar10[3];
      }
      else {
        local_270.field_2._M_allocated_capacity = *psVar14;
        local_270._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_270._M_string_length = plVar10[1];
      *plVar10 = (long)psVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_270);
      local_2b0._0_8_ = local_2b0 + 0x10;
      peVar15 = (element_type *)(plVar10 + 2);
      if ((element_type *)*plVar10 == peVar15) {
        local_2b0._16_8_ = (peVar15->super_Entity)._vptr_Entity;
        local_2b0._24_8_ = plVar10[3];
      }
      else {
        local_2b0._16_8_ = (peVar15->super_Entity)._vptr_Entity;
        local_2b0._0_8_ = (element_type *)*plVar10;
      }
      local_2b0._8_8_ = plVar10[1];
      *plVar10 = (long)peVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      NamedEntity::name_abi_cxx11_
                (&local_228,
                 (NamedEntity *)
                 ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_230->super_Logger)->_M_ptr);
      peVar33 = (element_type *)0xf;
      if ((element_type *)local_2b0._0_8_ != (element_type *)(local_2b0 + 0x10)) {
        peVar33 = (element_type *)local_2b0._16_8_;
      }
      peVar34 = (element_type *)
                ((long)(_func_int ***)local_2b0._8_8_ +
                (long)(_func_int ***)local_228._M_string_length);
      if (peVar33 < peVar34) {
        uVar32 = (element_type *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          uVar32 = local_228.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar32 < peVar34) goto LAB_00280127;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,local_2b0._0_8_);
      }
      else {
LAB_00280127:
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append(local_2b0,(ulong)local_228._M_dataplus._M_p);
      }
      local_2d0._0_8_ = local_2d0 + 0x10;
      psVar14 = puVar11 + 2;
      if ((size_type *)*puVar11 == psVar14) {
        local_2d0._16_8_ = *psVar14;
        local_2d0._24_8_ = puVar11[3];
      }
      else {
        local_2d0._16_8_ = *psVar14;
        local_2d0._0_8_ = (size_type *)*puVar11;
      }
      local_2d0._8_8_ = puVar11[1];
      *puVar11 = psVar14;
      puVar11[1] = 0;
      *(undefined1 *)psVar14 = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_2d0);
      pNVar20 = (NamedEntity *)(plVar10 + 2);
      if ((NamedEntity *)*plVar10 == pNVar20) {
        local_290._16_8_ = (pNVar20->super_ParentedEntity).super_Entity._vptr_Entity;
        local_290._24_8_ = plVar10[3];
        local_290._0_8_ = pNVar36;
      }
      else {
        local_290._16_8_ = (pNVar20->super_ParentedEntity).super_Entity._vptr_Entity;
        local_290._0_8_ = (NamedEntity *)*plVar10;
      }
      local_290._8_8_ = plVar10[1];
      *plVar10 = (long)pNVar20;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_1a0,(string *)local_290);
      if ((NamedEntity *)local_290._0_8_ != pNVar36) {
        operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
      }
      if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
        operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,
                        (ulong)(local_228.field_2._M_allocated_capacity + 1));
      }
      if ((element_type *)local_2b0._0_8_ != (element_type *)(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
      }
      pVVar31 = (ValidatorImpl *)local_290;
      Reset::resetValueId_abi_cxx11_((string *)local_290,(Reset *)local_208._0_8_);
      addIdMapItem(pVVar31,(string *)local_290,&local_1a0,local_1a8);
      if ((NamedEntity *)local_290._0_8_ != pNVar36) {
        operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
      }
    }
    cVar29 = '\x01';
    if (9 < uVar35) {
      uVar26 = uVar35;
      cVar7 = '\x04';
      do {
        cVar29 = cVar7;
        if (uVar26 < 100) {
          cVar29 = cVar29 + -2;
          goto LAB_00280329;
        }
        if (uVar26 < 1000) {
          cVar29 = cVar29 + -1;
          goto LAB_00280329;
        }
        if (uVar26 < 10000) goto LAB_00280329;
        bVar8 = 99999 < uVar26;
        uVar26 = uVar26 / 10000;
        cVar7 = cVar29 + '\x04';
      } while (bVar8);
      cVar29 = cVar29 + '\x01';
    }
LAB_00280329:
    local_250._0_8_ = local_250 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_250,cVar29);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_250._0_8_,local_250._8_4_,uVar35)
    ;
    puVar11 = (undefined8 *)std::__cxx11::string::replace((ulong)local_250,0,(char *)0x0,0x2a957b);
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    puVar18 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar18) {
      local_270.field_2._M_allocated_capacity = *puVar18;
      local_270.field_2._8_8_ = puVar11[3];
    }
    else {
      local_270.field_2._M_allocated_capacity = *puVar18;
      local_270._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_270._M_string_length = puVar11[1];
    *puVar11 = puVar18;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_270);
    local_2b0._0_8_ = local_2b0 + 0x10;
    pEVar19 = (Entity *)(plVar10 + 2);
    if ((Entity *)*plVar10 == pEVar19) {
      local_2b0._16_8_ = pEVar19->_vptr_Entity;
      local_2b0._24_8_ = plVar10[3];
    }
    else {
      local_2b0._16_8_ = pEVar19->_vptr_Entity;
      local_2b0._0_8_ = (Entity *)*plVar10;
    }
    local_2b0._8_8_ = plVar10[1];
    *plVar10 = (long)pEVar19;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    NamedEntity::name_abi_cxx11_
              (&local_228,
               (NamedEntity *)
               ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
               &local_230->super_Logger)->_M_ptr);
    peVar33 = (element_type *)0xf;
    if ((Entity *)local_2b0._0_8_ != (Entity *)(local_2b0 + 0x10)) {
      peVar33 = (element_type *)local_2b0._16_8_;
    }
    peVar34 = (element_type *)
              ((long)(_func_int ***)local_2b0._8_8_ +
              (long)(_func_int ***)local_228._M_string_length);
    if (peVar33 < peVar34) {
      uVar32 = (element_type *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        uVar32 = local_228.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar32 < peVar34) goto LAB_00280480;
      plVar10 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_228,0,(char *)0x0,local_2b0._0_8_);
    }
    else {
LAB_00280480:
      plVar10 = (long *)std::__cxx11::string::_M_append(local_2b0,(ulong)local_228._M_dataplus._M_p)
      ;
    }
    local_2d0._0_8_ = local_2d0 + 0x10;
    pIVar21 = (IdMap *)(plVar10 + 2);
    if ((IdMap *)*plVar10 == pIVar21) {
      local_2d0._16_8_ = *(undefined8 *)&(pIVar21->_M_t)._M_impl;
      local_2d0._24_8_ = plVar10[3];
    }
    else {
      local_2d0._16_8_ = *(undefined8 *)&(pIVar21->_M_t)._M_impl;
      local_2d0._0_8_ = (IdMap *)*plVar10;
    }
    local_2d0._8_8_ = plVar10[1];
    *plVar10 = (long)pIVar21;
    plVar10[1] = 0;
    *(undefined1 *)&(pIVar21->_M_t)._M_impl = 0;
    plVar10 = (long *)std::__cxx11::string::append(local_2d0);
    pNVar20 = (NamedEntity *)(plVar10 + 2);
    if ((NamedEntity *)*plVar10 == pNVar20) {
      local_290._16_8_ = (pNVar20->super_ParentedEntity).super_Entity._vptr_Entity;
      local_290._24_8_ = plVar10[3];
      local_290._0_8_ = pNVar36;
    }
    else {
      local_290._16_8_ = (pNVar20->super_ParentedEntity).super_Entity._vptr_Entity;
      local_290._0_8_ = (NamedEntity *)*plVar10;
    }
    local_290._8_8_ = plVar10[1];
    *plVar10 = (long)pNVar20;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a0,(string *)local_290);
    if ((NamedEntity *)local_290._0_8_ != pNVar36) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    if ((IdMap *)local_2d0._0_8_ != (IdMap *)(local_2d0 + 0x10)) {
      operator_delete((void *)local_2d0._0_8_,(ulong)(local_2d0._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,
                      (ulong)(local_228.field_2._M_allocated_capacity + 1));
    }
    if ((Entity *)local_2b0._0_8_ != (Entity *)(local_2b0 + 0x10)) {
      operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,
                      (ulong)(local_270.field_2._M_allocated_capacity + 1));
    }
    if ((ValidatorImpl *)local_250._0_8_ != (ValidatorImpl *)(local_250 + 0x10)) {
      operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
    }
    Reset::resetValue_abi_cxx11_((string *)local_290,(Reset *)local_208._0_8_);
    buildMathIdMap(local_140,&local_1a0,local_1a8,(string *)local_290);
    if ((NamedEntity *)local_290._0_8_ != pNVar36) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
    }
    uVar35 = uVar35 + 1;
  }
  NamedEntity::name_abi_cxx11_
            ((string *)local_2b0,
             (NamedEntity *)
             ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
             &local_230->super_Logger)->_M_ptr);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)local_2b0,0,(char *)0x0,0x2a9591);
  local_2d0._0_8_ = local_2d0 + 0x10;
  pEVar19 = (Entity *)(plVar10 + 2);
  if ((Entity *)*plVar10 == pEVar19) {
    local_2d0._16_8_ = pEVar19->_vptr_Entity;
    local_2d0._24_8_ = plVar10[3];
  }
  else {
    local_2d0._16_8_ = pEVar19->_vptr_Entity;
    local_2d0._0_8_ = (Entity *)*plVar10;
  }
  local_2d0._8_8_ = plVar10[1];
  *plVar10 = (long)pEVar19;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append(local_2d0);
  psVar14 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar14) {
    local_290._16_8_ = *psVar14;
    local_290._24_8_ = plVar10[3];
    local_290._0_8_ = pcVar37;
  }
  else {
    local_290._16_8_ = *psVar14;
    local_290._0_8_ = (size_type *)*plVar10;
  }
  local_290._8_8_ = plVar10[1];
  *plVar10 = (long)psVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_1a0,(string *)local_290);
  if ((pointer)local_290._0_8_ != pcVar37) {
    operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
  }
  if ((Entity *)local_2d0._0_8_ != (Entity *)(local_2d0 + 0x10)) {
    operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
  }
  if ((Entity *)local_2b0._0_8_ != (Entity *)(local_2b0 + 0x10)) {
    operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
  }
  Component::math_abi_cxx11_
            ((string *)local_290,
             ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
             &local_230->super_Logger)->_M_ptr);
  buildMathIdMap(local_140,&local_1a0,local_1a8,(string *)local_290);
  if ((pointer)local_290._0_8_ != pcVar37) {
    operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
  }
  ImportedEntity::importSource
            (&((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
              &local_230->super_Logger)->_M_ptr->super_ImportedEntity);
  if ((Entity *)local_2d0._0_8_ == (Entity *)0x0) {
    bVar8 = false;
  }
  else {
    ImportedEntity::importSource
              (&((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                &local_230->super_Logger)->_M_ptr->super_ImportedEntity);
    Entity::id_abi_cxx11_((string *)local_290,(Entity *)local_2b0._0_8_);
    bVar8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((pointer)local_290._0_8_ != pcVar37) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0._8_8_);
  }
  if (bVar8) {
    NamedEntity::name_abi_cxx11_
              ((string *)local_2b0,
               (NamedEntity *)
               ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
               &local_230->super_Logger)->_M_ptr);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)local_2b0,0,(char *)0x0,0x2a95a5);
    local_2d0._0_8_ = local_2d0 + 0x10;
    pEVar19 = (Entity *)(plVar10 + 2);
    if ((Entity *)*plVar10 == pEVar19) {
      local_2d0._16_8_ = pEVar19->_vptr_Entity;
      local_2d0._24_8_ = plVar10[3];
    }
    else {
      local_2d0._16_8_ = pEVar19->_vptr_Entity;
      local_2d0._0_8_ = (Entity *)*plVar10;
    }
    local_2d0._8_8_ = plVar10[1];
    *plVar10 = (long)pEVar19;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append(local_2d0);
    psVar14 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar14) {
      local_290._16_8_ = *psVar14;
      local_290._24_8_ = plVar10[3];
      local_290._0_8_ = pcVar37;
    }
    else {
      local_290._16_8_ = *psVar14;
      local_290._0_8_ = (size_type *)*plVar10;
    }
    local_290._8_8_ = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a0,(string *)local_290);
    if ((pointer)local_290._0_8_ != pcVar37) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    if ((Entity *)local_2d0._0_8_ != (Entity *)(local_2d0 + 0x10)) {
      operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
    }
    if ((Entity *)local_2b0._0_8_ != (Entity *)(local_2b0 + 0x10)) {
      operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
    }
    ImportedEntity::importSource
              (&((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                &local_230->super_Logger)->_M_ptr->super_ImportedEntity);
    pVVar31 = (ValidatorImpl *)local_290;
    Entity::id_abi_cxx11_((string *)pVVar31,(Entity *)local_2d0._0_8_);
    addIdMapItem(pVVar31,(string *)local_290,&local_1a0,local_1a8);
    if ((pointer)local_290._0_8_ != pcVar37) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0._8_8_);
    }
  }
  ComponentEntity::encapsulationId_abi_cxx11_
            ((string *)local_290,
             &((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
              &local_230->super_Logger)->_M_ptr->super_ComponentEntity);
  uVar32 = local_290._8_8_;
  if ((pointer)local_290._0_8_ != pcVar37) {
    operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar32 ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00280f09;
  ComponentEntity::encapsulationId_abi_cxx11_
            ((string *)local_290,
             &((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
              &local_230->super_Logger)->_M_ptr->super_ComponentEntity);
  bVar8 = isValidXmlName((string *)local_290);
  if ((pointer)local_290._0_8_ != pcVar37) {
    operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
  }
  if (!bVar8) {
    Issue::IssueImpl::create();
    Issue::IssueImpl::setReferenceRule(*(IssueImpl **)(local_208._0_8_ + 8),XML_ID_ATTRIBUTE);
    AnyCellmlElement::AnyCellmlElementImpl::setComponent
              (*(AnyCellmlElementImpl **)
                (*(EntityImpl **)(local_208._0_8_ + 8))[1].mId._M_string_length,
               (ComponentPtr *)local_230,COMPONENT);
    pIVar4 = *(IssueImpl **)(local_208._0_8_ + 8);
    NamedEntity::name_abi_cxx11_
              ((string *)local_250,
               (NamedEntity *)
               ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
               &local_230->super_Logger)->_M_ptr);
    puVar11 = (undefined8 *)std::__cxx11::string::replace((ulong)local_250,0,(char *)0x0,0x2a8fe4);
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    puVar18 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar18) {
      local_270.field_2._M_allocated_capacity = *puVar18;
      local_270.field_2._8_8_ = puVar11[3];
    }
    else {
      local_270.field_2._M_allocated_capacity = *puVar18;
      local_270._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_270._M_string_length = puVar11[1];
    *puVar11 = puVar18;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_270);
    local_2b0._0_8_ = local_2b0 + 0x10;
    pEVar19 = (Entity *)(plVar10 + 2);
    if ((Entity *)*plVar10 == pEVar19) {
      local_2b0._16_8_ = pEVar19->_vptr_Entity;
      local_2b0._24_8_ = plVar10[3];
    }
    else {
      local_2b0._16_8_ = pEVar19->_vptr_Entity;
      local_2b0._0_8_ = (Entity *)*plVar10;
    }
    local_2b0._8_8_ = plVar10[1];
    *plVar10 = (long)pEVar19;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ComponentEntity::encapsulationId_abi_cxx11_
              (&local_228,
               &((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                &local_230->super_Logger)->_M_ptr->super_ComponentEntity);
    peVar33 = (element_type *)
              ((long)(_func_int ***)local_2b0._8_8_ +
              (long)(_func_int ***)local_228._M_string_length);
    peVar34 = (element_type *)0xf;
    if ((Entity *)local_2b0._0_8_ != (Entity *)(local_2b0 + 0x10)) {
      peVar34 = (element_type *)local_2b0._16_8_;
    }
    if (peVar34 < peVar33) {
      uVar32 = (element_type *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        uVar32 = local_228.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar32 < peVar33) goto LAB_00280c02;
      plVar10 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_228,0,(char *)0x0,local_2b0._0_8_);
    }
    else {
LAB_00280c02:
      plVar10 = (long *)std::__cxx11::string::_M_append(local_2b0,(ulong)local_228._M_dataplus._M_p)
      ;
    }
    local_2d0._0_8_ = local_2d0 + 0x10;
    pEVar19 = (Entity *)(plVar10 + 2);
    if ((Entity *)*plVar10 == pEVar19) {
      local_2d0._16_8_ = pEVar19->_vptr_Entity;
      local_2d0._24_8_ = plVar10[3];
    }
    else {
      local_2d0._16_8_ = pEVar19->_vptr_Entity;
      local_2d0._0_8_ = (Entity *)*plVar10;
    }
    local_2d0._8_8_ = plVar10[1];
    *plVar10 = (long)pEVar19;
    plVar10[1] = 0;
    *(undefined1 *)&pEVar19->_vptr_Entity = 0;
    plVar10 = (long *)std::__cxx11::string::append(local_2d0);
    psVar14 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar14) {
      local_290._16_8_ = *psVar14;
      local_290._24_8_ = plVar10[3];
      local_290._0_8_ = pcVar37;
    }
    else {
      local_290._16_8_ = *psVar14;
      local_290._0_8_ = (size_type *)*plVar10;
    }
    local_290._8_8_ = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    Issue::IssueImpl::setDescription(pIVar4,(string *)local_290);
    if ((pointer)local_290._0_8_ != pcVar37) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    if ((Entity *)local_2d0._0_8_ != (Entity *)(local_2d0 + 0x10)) {
      operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,
                      (ulong)(local_228.field_2._M_allocated_capacity + 1));
    }
    if ((Entity *)local_2b0._0_8_ != (Entity *)(local_2b0 + 0x10)) {
      operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,
                      (ulong)(local_270.field_2._M_allocated_capacity + 1));
    }
    if ((ValidatorImpl *)local_250._0_8_ != (ValidatorImpl *)(local_250 + 0x10)) {
      operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
    }
    Logger::LoggerImpl::addIssue(&local_140->super_LoggerImpl,(IssuePtr *)local_208);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
    }
  }
  NamedEntity::name_abi_cxx11_
            ((string *)local_2b0,
             (NamedEntity *)
             ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
             &local_230->super_Logger)->_M_ptr);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)local_2b0,0,(char *)0x0,0x2a95c6);
  local_2d0._0_8_ = local_2d0 + 0x10;
  pEVar19 = (Entity *)(plVar10 + 2);
  if ((Entity *)*plVar10 == pEVar19) {
    local_2d0._16_8_ = pEVar19->_vptr_Entity;
    local_2d0._24_8_ = plVar10[3];
  }
  else {
    local_2d0._16_8_ = pEVar19->_vptr_Entity;
    local_2d0._0_8_ = (Entity *)*plVar10;
  }
  local_2d0._8_8_ = plVar10[1];
  *plVar10 = (long)pEVar19;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append(local_2d0);
  psVar14 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar14) {
    local_290._16_8_ = *psVar14;
    local_290._24_8_ = plVar10[3];
    local_290._0_8_ = pcVar37;
  }
  else {
    local_290._16_8_ = *psVar14;
    local_290._0_8_ = (size_type *)*plVar10;
  }
  local_290._8_8_ = plVar10[1];
  *plVar10 = (long)psVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_1a0,(string *)local_290);
  if ((pointer)local_290._0_8_ != pcVar37) {
    operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
  }
  if ((Entity *)local_2d0._0_8_ != (Entity *)(local_2d0 + 0x10)) {
    operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
  }
  if ((Entity *)local_2b0._0_8_ != (Entity *)(local_2b0 + 0x10)) {
    operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
  }
  pVVar31 = (ValidatorImpl *)local_290;
  ComponentEntity::encapsulationId_abi_cxx11_
            ((string *)pVVar31,
             &((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
              &local_230->super_Logger)->_M_ptr->super_ComponentEntity);
  addIdMapItem(pVVar31,(string *)local_290,&local_1a0,local_1a8);
  if ((pointer)local_290._0_8_ != pcVar37) {
    operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
  }
LAB_00280f09:
  uVar35 = 0;
  while( true ) {
    sVar12 = ComponentEntity::componentCount
                       (&((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                         &local_230->super_Logger)->_M_ptr->super_ComponentEntity);
    if (sVar12 <= uVar35) break;
    ComponentEntity::component
              ((ComponentEntity *)local_290,
               (size_t)((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                       &local_230->super_Logger)->_M_ptr);
    buildComponentIdMap(local_140,(ComponentPtr *)local_290,local_1a8,
                        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290._8_8_);
    }
    uVar35 = uVar35 + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,
                    CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,
                             local_1a0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Validator::ValidatorImpl::buildComponentIdMap(const ComponentPtr &component, IdMap &idMap, std::set<std::string> &reportedConnections)
{
    std::string info;

    // Component.
    if (!component->id().empty()) {
        std::string imported;
        std::string owning;
        if (component->isImport()) {
            imported = "imported ";
        }
        if (owningComponent(component) != nullptr) {
            owning = "' in component '" + owningComponent(component)->name() + "'";
        } else {
            owning = "' in model '" + owningModel(component)->name() + "'";
        }
        info = " - " + imported + "component '" + component->name() + owning;
        addIdMapItem(component->id(), info, idMap);
    }

    // Variables.
    for (size_t i = 0; i < component->variableCount(); ++i) {
        auto item = component->variable(i);
        if (!item->id().empty()) {
            info = " - variable '" + item->name() + "' in component '" + component->name() + "'";
            addIdMapItem(item->id(), info, idMap);
        }
        // Equivalent variables.
        for (size_t e = 0; e < item->equivalentVariableCount(); ++e) {
            auto equiv = item->equivalentVariable(e);
            auto equivParent = owningComponent(equiv);
            if (equivParent != nullptr) {
                // Skipping half of the equivalences to avoid duplicate reporting.
                std::string s1 = item->name() + component->name();
                std::string s2 = equiv->name() + equivParent->name();
                std::string mappingId = Variable::equivalenceMappingId(item, equiv);
                // Variable mapping.
                if ((s1 < s2) && !mappingId.empty()) {
                    std::string mappingDescription =
                        "between variable '" + item->name() + "' in component '" + component->name()
                        + "' and variable '" + equiv->name() + "' in component '" + equivParent->name() + "'";
                    // Check for a valid identifier.
                    if (!isValidXmlName(mappingId)) {
                        auto issue = Issue::IssueImpl::create();
                        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
                        issue->mPimpl->mItem->mPimpl->setMapVariables(item, equiv);
                        issue->mPimpl->setDescription("Variable equivalence " + mappingDescription + ", does not have a valid map_variables 'id' attribute, '" + mappingId + "'.");
                        addIssue(issue);
                    }

                    info = " - variable equivalence " + mappingDescription;
                    addIdMapItem(mappingId, info, idMap);
                }
                // Connections.
                auto connectionId = Variable::equivalenceConnectionId(item, equiv);
                std::string connection = component->name() < equivParent->name() ? component->name() + equivParent->name() : equivParent->name() + component->name();
                if ((s1 < s2) && !connectionId.empty() && (reportedConnections.count(connection) == 0)) {
                    std::string connectionDescription =
                        "between components '" + component->name() + "' and '" + equivParent->name()
                        + "' because of variable equivalence between variables '" + item->name()
                        + "' and '" + equiv->name() + "'";
                    // Check for a valid identifier.
                    if (!isValidXmlName(connectionId)) {
                        auto issue = Issue::IssueImpl::create();
                        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
                        issue->mPimpl->mItem->mPimpl->setConnection(item, equiv);
                        issue->mPimpl->setDescription("Connection " + connectionDescription + ", does not have a valid connection 'id' attribute, '" + connectionId + "'.");
                        addIssue(issue);
                    }

                    reportedConnections.insert(connection);
                    info = " - connection " + connectionDescription;
                    addIdMapItem(connectionId, info, idMap);
                }
            }
        }
    }

    // Resets.
    for (size_t i = 0; i < component->resetCount(); ++i) {
        auto item = component->reset(i);
        if (!item->id().empty()) {
            info = " - reset at index " + std::to_string(i) + " in component '" + component->name() + "'";
            addIdMapItem(item->id(), info, idMap);
        }
        if (!item->testValueId().empty()) {
            info = " - test_value in reset at index " + std::to_string(i) + " in component '" + component->name() + "'";
            addIdMapItem(item->testValueId(), info, idMap);
        }
        info = "test_value in reset " + std::to_string(i) + " in component '" + component->name() + "'";
        buildMathIdMap(info, idMap, item->testValue());
        if (!item->resetValueId().empty()) {
            info = " - reset_value in reset at index " + std::to_string(i) + " in component '" + component->name() + "'";
            addIdMapItem(item->resetValueId(), info, idMap);
        }
        info = "reset_value in reset " + std::to_string(i) + " in component '" + component->name() + "'";
        buildMathIdMap(info, idMap, item->resetValue());
    }

    // Maths.
    info = "math in component '" + component->name() + "'";
    buildMathIdMap(info, idMap, component->math());

    // Imports.
    if ((component->importSource() != nullptr) && !component->importSource()->id().empty()) {
        info = " - import source for component '" + component->name() + "'";
        addIdMapItem(component->importSource()->id(), info, idMap);
    }

    // Hierarchy.
    if (!component->encapsulationId().empty()) {
        // Check for a valid identifier.
        if (!isValidXmlName(component->encapsulationId())) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
            issue->mPimpl->mItem->mPimpl->setComponent(component);
            issue->mPimpl->setDescription("Component '" + component->name() + "' does not have a valid encapsulation 'id' attribute, '" + component->encapsulationId() + "'.");
            addIssue(issue);
        }

        info = " - encapsulation component_ref to component '" + component->name() + "'";
        addIdMapItem(component->encapsulationId(), info, idMap);
    }

    // Child components.
    for (size_t c = 0; c < component->componentCount(); ++c) {
        buildComponentIdMap(component->component(c), idMap, reportedConnections);
    }
}